

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_witness_program_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  uint flags_00;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if (((((bytes != (uchar *)0x0 || bytes_len == 0) && (written != (size_t *)0x0)) && (len != 0)) &&
      ((bytes_out != (uchar *)0x0 && (flags < 8)))) && (flags_00 = flags & 3, flags_00 != 3)) {
    if (flags_00 == 0) {
      if ((bytes_len != 0x20) && (bytes_len != 0x14)) {
        return -2;
      }
    }
    else if (bytes_len == 0) {
      return -2;
    }
    puVar3 = bytes_out;
    if (3 < flags) {
      if (len < 2) {
        return -2;
      }
      len = len - 1;
      puVar3 = bytes_out + 1;
    }
    *puVar3 = '\0';
    iVar2 = wally_script_push_from_bytes(bytes,bytes_len,flags_00,puVar3 + 1,len - 1,written);
    if (iVar2 == 0) {
      sVar1 = *written;
      iVar2 = 0;
      *written = sVar1 + 1;
      if (3 < flags) {
        *bytes_out = (uchar)(sVar1 + 1);
        *written = *written + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int wally_witness_program_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                     uint32_t flags,
                                     unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) ||
        !script_flags_ok(flags, WALLY_SCRIPT_AS_PUSH) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & ALL_SCRIPT_HASH_FLAGS) {
        if (!bytes_len)
            return WALLY_EINVAL;
    } else if (bytes_len != HASH160_LEN && bytes_len != SHA256_LEN) {
        /* Only v0 witness scripts are currently supported */
        return WALLY_EINVAL;
    }
    if (flags & WALLY_SCRIPT_AS_PUSH) {
        if (len < 2)
            return WALLY_EINVAL;
        ++bytes_out;
        --len;
    }

    bytes_out[0] = 0; /* Witness version */
    ret = wally_script_push_from_bytes(bytes, bytes_len,
                                       flags & ~WALLY_SCRIPT_AS_PUSH,
                                       bytes_out + 1, len - 1, written);
    if (ret == WALLY_OK) {
        *written += 1; /* For Witness version byte */
        if (flags & WALLY_SCRIPT_AS_PUSH) {
            *p = *written & 0xff;
            *written += 1; /* For Witness version byte */
        }
    }
    return ret;
}